

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::TextFlow::Spacer::Spacer(Spacer *this,size_t spaceWidth)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Column *in_RDI;
  string *in_stack_ffffffffffffffb8;
  Column *in_stack_ffffffffffffffc0;
  allocator<char> local_31;
  string local_30 [16];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  Column::Column(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ::std::__cxx11::string::~string(local_30);
  ::std::allocator<char>::~allocator(&local_31);
  Column::width(in_RDI,(size_t)in_RSI);
  return;
}

Assistant:

explicit Spacer(size_t spaceWidth) : Column("") {
		width(spaceWidth);
	}